

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChunkV.cpp
# Opt level: O3

size_t __thiscall
adios2::format::ChunkV::AddToVec
          (ChunkV *this,size_t size,void *buf,size_t align,bool CopyReqd,MemorySpace MemSpace)

{
  pointer *ppVVar1;
  size_t *psVar2;
  pointer pVVar3;
  iterator __position;
  iterator __position_00;
  size_t sVar4;
  size_t sVar5;
  pointer pCVar6;
  size_t sVar7;
  ulong size_00;
  char *__dest;
  Chunk *v;
  VecEntry entry;
  Chunk c;
  VecEntry local_78;
  size_t local_58;
  size_t *local_50;
  Chunk local_48;
  
  BufferV::AlignBuffer(&this->super_BufferV,align);
  sVar5 = (this->super_BufferV).CurOffset;
  if (size == 0) {
    return sVar5;
  }
  if ((CopyReqd) || ((this->super_BufferV).m_AlwaysCopy != false)) {
    pVVar3 = (this->super_BufferV).DataV.
             super__Vector_base<adios2::format::BufferV::VecEntry,_std::allocator<adios2::format::BufferV::VecEntry>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if ((pVVar3 != (this->super_BufferV).DataV.
                   super__Vector_base<adios2::format::BufferV::VecEntry,_std::allocator<adios2::format::BufferV::VecEntry>_>
                   ._M_impl.super__Vector_impl_data._M_start) && (pVVar3[-1].External == false)) {
      sVar7 = this->m_TailChunkPos;
      __dest = this->m_TailChunk->Ptr + sVar7;
      if (__dest + -pVVar3[-1].Size == (char *)pVVar3[-1].Base) {
        if (sVar7 + size <= this->m_ChunkSize) {
          memcpy(__dest,buf,size);
          psVar2 = &(this->super_BufferV).DataV.
                    super__Vector_base<adios2::format::BufferV::VecEntry,_std::allocator<adios2::format::BufferV::VecEntry>_>
                    ._M_impl.super__Vector_impl_data._M_finish[-1].Size;
          *psVar2 = *psVar2 + size;
          this->m_TailChunkPos = this->m_TailChunkPos + size;
          goto LAB_004a862a;
        }
        local_50 = &this->m_TailChunkPos;
        v = (this->m_Chunks).
            super__Vector_base<adios2::format::ChunkV::Chunk,_std::allocator<adios2::format::ChunkV::Chunk>_>
            ._M_impl.super__Vector_impl_data._M_finish + -1;
        sVar4 = ChunkAlloc(this,v,sVar7);
        sVar7 = this->m_TailChunkPos;
        if (sVar4 - sVar7 != 0) {
          local_58 = sVar7;
          memset(v->Ptr + sVar7,0,sVar4 - sVar7);
          sVar7 = local_58;
        }
        sVar5 = (sVar4 + sVar5) - sVar7;
        pVVar3 = (this->super_BufferV).DataV.
                 super__Vector_base<adios2::format::BufferV::VecEntry,_std::allocator<adios2::format::BufferV::VecEntry>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pVVar3[-1].Size = sVar4;
        pVVar3[-1].Base = v->Ptr;
        *local_50 = 0;
        local_50[1] = 0;
      }
    }
    size_00 = this->m_ChunkSize;
    if (this->m_ChunkSize <= size) {
      size_00 = size;
    }
    local_48.Ptr = (char *)0x0;
    local_48.AllocatedPtr = (void *)0x0;
    local_48.Size = 0;
    ChunkAlloc(this,&local_48,size_00);
    __position._M_current =
         (this->m_Chunks).
         super__Vector_base<adios2::format::ChunkV::Chunk,_std::allocator<adios2::format::ChunkV::Chunk>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->m_Chunks).
        super__Vector_base<adios2::format::ChunkV::Chunk,_std::allocator<adios2::format::ChunkV::Chunk>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<adios2::format::ChunkV::Chunk,std::allocator<adios2::format::ChunkV::Chunk>>::
      _M_realloc_insert<adios2::format::ChunkV::Chunk_const&>
                ((vector<adios2::format::ChunkV::Chunk,std::allocator<adios2::format::ChunkV::Chunk>>
                  *)&this->m_Chunks,__position,&local_48);
      pCVar6 = (this->m_Chunks).
               super__Vector_base<adios2::format::ChunkV::Chunk,_std::allocator<adios2::format::ChunkV::Chunk>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      (__position._M_current)->Size = local_48.Size;
      (__position._M_current)->Ptr = local_48.Ptr;
      (__position._M_current)->AllocatedPtr = local_48.AllocatedPtr;
      pCVar6 = (this->m_Chunks).
               super__Vector_base<adios2::format::ChunkV::Chunk,_std::allocator<adios2::format::ChunkV::Chunk>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
      (this->m_Chunks).
      super__Vector_base<adios2::format::ChunkV::Chunk,_std::allocator<adios2::format::ChunkV::Chunk>_>
      ._M_impl.super__Vector_impl_data._M_finish = pCVar6;
    }
    this->m_TailChunk = pCVar6 + -1;
    memcpy(pCVar6[-1].Ptr,buf,size);
    this->m_TailChunkPos = size;
    local_78.External = false;
    local_78.Base = this->m_TailChunk->Ptr;
  }
  else {
    local_78.External = true;
    local_78.Base = buf;
  }
  local_78.Offset = 0;
  __position_00._M_current =
       (this->super_BufferV).DataV.
       super__Vector_base<adios2::format::BufferV::VecEntry,_std::allocator<adios2::format::BufferV::VecEntry>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position_00._M_current ==
      (this->super_BufferV).DataV.
      super__Vector_base<adios2::format::BufferV::VecEntry,_std::allocator<adios2::format::BufferV::VecEntry>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_78.Size = size;
    std::vector<adios2::format::BufferV::VecEntry,std::allocator<adios2::format::BufferV::VecEntry>>
    ::_M_realloc_insert<adios2::format::BufferV::VecEntry_const&>
              ((vector<adios2::format::BufferV::VecEntry,std::allocator<adios2::format::BufferV::VecEntry>>
                *)&(this->super_BufferV).DataV,__position_00,&local_78);
  }
  else {
    (__position_00._M_current)->Offset = 0;
    (__position_00._M_current)->Size = size;
    *(ulong *)__position_00._M_current = CONCAT71(local_78._1_7_,local_78.External);
    (__position_00._M_current)->Base = local_78.Base;
    ppVVar1 = &(this->super_BufferV).DataV.
               super__Vector_base<adios2::format::BufferV::VecEntry,_std::allocator<adios2::format::BufferV::VecEntry>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppVVar1 = *ppVVar1 + 1;
  }
LAB_004a862a:
  (this->super_BufferV).CurOffset = size + sVar5;
  return sVar5;
}

Assistant:

size_t ChunkV::AddToVec(const size_t size, const void *buf, size_t align, bool CopyReqd,
                        MemorySpace MemSpace)
{
    AlignBuffer(align); // may call back AddToVec recursively
    size_t retOffset = CurOffset;

    if (size == 0)
    {
        return CurOffset;
    }

    /* std::cout << "  AddToVec: size = " << size << " copy = " << CopyReqd
              << std::endl; */
    if (!CopyReqd && !m_AlwaysCopy)
    {
        /*std::cout << "    add external = " << size << std::endl;*/
        // just add buf to internal version of output vector
        VecEntry entry = {true, buf, 0, size};
        DataV.push_back(entry);
    }
    else
    {
        // we can possibly append this entry to the last if the last was
        // internal
        bool AppendPossible =
            DataV.size() && !DataV.back().External &&
            (m_TailChunk->Ptr + m_TailChunkPos - DataV.back().Size == DataV.back().Base);

        if (AppendPossible && (m_TailChunkPos + size > m_ChunkSize))
        {
            // No room in current chunk, close it out
            // realloc down to used size (helpful?) and set size in array
            /*std::cout << "    downsize ptr = " << m_Chunks.back().Ptr
                      << " to size = " << m_TailChunkPos << std::endl;*/
            Chunk &c = m_Chunks.back();
            size_t actualsize = ChunkAlloc(c, m_TailChunkPos);
            size_t alignment = actualsize - m_TailChunkPos;
            if (alignment)
            {
                auto p = c.Ptr + m_TailChunkPos;
                std::fill(p, p + alignment, 0);
            }
            retOffset += alignment;
            // Update entry in DataV as size and potentiall ptr has changed
            // Learned from sanitizer: downsizing realloc still may change pointer
            VecEntry &dv = DataV.back();
            dv.Size = actualsize;
            dv.Base = c.Ptr;
            m_TailChunkPos = 0;
            m_TailChunk = nullptr;
            AppendPossible = false;
        }
        if (AppendPossible)
        {
            // We can use current chunk, just append the data;
            /*std::cout << "    append to current chunk ptr = "
                      << m_TailChunk->Ptr << " at pos = " << m_TailChunkPos
                      << " add size = " << size << std::endl; */
            CopyDataToBuffer(size, buf, m_TailChunkPos, MemSpace);
            DataV.back().Size += size;
            m_TailChunkPos += size;
        }
        else
        {
            // We need a new chunk, get the larger of size or m_ChunkSize
            /*  std::cout << "    get a new chunk size = " << m_ChunkSize
                      << std::endl; */
            size_t NewSize = m_ChunkSize;
            if (size > m_ChunkSize)
                NewSize = size;
            Chunk c{nullptr, nullptr, 0};
            ChunkAlloc(c, NewSize);
            m_Chunks.push_back(c);
            m_TailChunk = &m_Chunks.back();
            CopyDataToBuffer(size, buf, 0, MemSpace);
            m_TailChunkPos = size;
            VecEntry entry = {false, m_TailChunk->Ptr, 0, size};
            DataV.push_back(entry);
        }
    }
    CurOffset = retOffset + size;
    return retOffset;
}